

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void mg_cry_internal_impl(mg_connection *conn,char *func,uint line,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  time_t tVar2;
  char *local_20c8;
  time_t timestamp;
  mg_file fi;
  char src_addr [50];
  char local_2038 [8];
  char buf [8192];
  __va_list_tag *ap_local;
  char *fmt_local;
  uint line_local;
  char *func_local;
  mg_connection *conn_local;
  
  vsnprintf(local_2038,0x2000,fmt,ap);
  buf[0x1ff7] = '\0';
  if (conn == (mg_connection *)0x0) {
    puts(local_2038);
  }
  else if (((conn->phys_ctx->callbacks).log_message == (_func_int_mg_connection_ptr_char_ptr *)0x0)
          || (iVar1 = (*(conn->phys_ctx->callbacks).log_message)(conn,local_2038), iVar1 == 0)) {
    if (conn->dom_ctx->config[0x11] == (char *)0x0) {
      fi.stat.location = 0;
      fi.stat._28_4_ = 0;
    }
    else {
      iVar1 = mg_fopen(conn,conn->dom_ctx->config[0x11],4,(mg_file *)&timestamp);
      if (iVar1 == 0) {
        fi.stat.location = 0;
        fi.stat._28_4_ = 0;
      }
    }
    if (fi.stat._24_8_ != 0) {
      flockfile((FILE *)fi.stat._24_8_);
      tVar2 = time((time_t *)0x0);
      sockaddr_to_string((char *)&fi.access,0x32,&(conn->client).rsa);
      fprintf((FILE *)fi.stat._24_8_,"[%010lu] [error] [client %s] ",tVar2,&fi.access);
      if ((conn->request_info).request_method != (char *)0x0) {
        if ((conn->request_info).request_uri == (char *)0x0) {
          local_20c8 = "";
        }
        else {
          local_20c8 = (conn->request_info).request_uri;
        }
        fprintf((FILE *)fi.stat._24_8_,"%s %s: ",(conn->request_info).request_method,local_20c8);
      }
      fprintf((FILE *)fi.stat._24_8_,"%s",local_2038);
      fputc(10,(FILE *)fi.stat._24_8_);
      fflush((FILE *)fi.stat._24_8_);
      funlockfile((FILE *)fi.stat._24_8_);
      mg_fclose((mg_file_access *)&fi.stat.location);
    }
  }
  return;
}

Assistant:

static void
mg_cry_internal_impl(const struct mg_connection *conn,
                     const char *func,
                     unsigned line,
                     const char *fmt,
                     va_list ap)
{
	char buf[MG_BUF_LEN], src_addr[IP_ADDR_STR_LEN];
	struct mg_file fi;
	time_t timestamp;

	/* Unused, in the RELEASE build */
	(void)func;
	(void)line;

#if defined(GCC_DIAGNOSTIC)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wformat-nonliteral"
#endif

	IGNORE_UNUSED_RESULT(vsnprintf_impl(buf, sizeof(buf), fmt, ap));

#if defined(GCC_DIAGNOSTIC)
#pragma GCC diagnostic pop
#endif

	buf[sizeof(buf) - 1] = 0;

	DEBUG_TRACE("mg_cry called from %s:%u: %s", func, line, buf);

	if (!conn) {
		puts(buf);
		return;
	}

	/* Do not lock when getting the callback value, here and below.
	 * I suppose this is fine, since function cannot disappear in the
	 * same way string option can. */
	if ((conn->phys_ctx->callbacks.log_message == NULL)
	    || (conn->phys_ctx->callbacks.log_message(conn, buf) == 0)) {

		if (conn->dom_ctx->config[ERROR_LOG_FILE] != NULL) {
			if (mg_fopen(conn,
			             conn->dom_ctx->config[ERROR_LOG_FILE],
			             MG_FOPEN_MODE_APPEND,
			             &fi)
			    == 0) {
				fi.access.fp = NULL;
			}
		} else {
			fi.access.fp = NULL;
		}

		if (fi.access.fp != NULL) {
			flockfile(fi.access.fp);
			timestamp = time(NULL);

			sockaddr_to_string(src_addr, sizeof(src_addr), &conn->client.rsa);
			fprintf(fi.access.fp,
			        "[%010lu] [error] [client %s] ",
			        (unsigned long)timestamp,
			        src_addr);

			if (conn->request_info.request_method != NULL) {
				fprintf(fi.access.fp,
				        "%s %s: ",
				        conn->request_info.request_method,
				        conn->request_info.request_uri
				            ? conn->request_info.request_uri
				            : "");
			}

			fprintf(fi.access.fp, "%s", buf);
			fputc('\n', fi.access.fp);
			fflush(fi.access.fp);
			funlockfile(fi.access.fp);
			(void)mg_fclose(&fi.access); /* Ignore errors. We can't call
			                              * mg_cry here anyway ;-) */
		}
	}
}